

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.cpp
# Opt level: O0

void __thiscall
Centaurus::CompositeATN<wchar_t>::build_wildcard_departure_set
          (CompositeATN<wchar_t> *this,CATNDepartureSetFactory<wchar_t> *deptset_factory,
          Identifier *id,int color,PriorityChain *priority,ATNStateStack *stack)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CATNNode<wchar_t> *this_00;
  Identifier *this_01;
  SimpleException *this_02;
  ATNPath local_b8;
  undefined1 local_95;
  allocator local_81;
  string local_80;
  int local_5c;
  reference pvStack_58;
  int i;
  value_type *p;
  const_iterator __end0;
  const_iterator __begin0;
  unordered_map<Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>_>_>
  *__range2;
  ATNStateStack *stack_local;
  PriorityChain *priority_local;
  int color_local;
  Identifier *id_local;
  CATNDepartureSetFactory<wchar_t> *deptset_factory_local;
  CompositeATN<wchar_t> *this_local;
  
  __end0 = std::
           unordered_map<Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>_>_>
           ::begin(&this->m_dict);
  p = (value_type *)
      std::
      unordered_map<Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>_>_>
      ::end(&this->m_dict);
  do {
    bVar1 = std::__detail::operator!=
                      (&__end0.
                        super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>,_true>
                       ,(_Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>,_true>
                         *)&p);
    if (!bVar1) {
      return;
    }
    pvStack_58 = std::__detail::
                 _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>,_false,_true>
                 ::operator*(&__end0);
    for (local_5c = 0; iVar3 = local_5c,
        iVar2 = CATNMachine<wchar_t>::get_num_nodes(&pvStack_58->second), iVar3 < iVar2;
        local_5c = local_5c + 1) {
      this_00 = CATNMachine<wchar_t>::operator[](&pvStack_58->second,local_5c);
      this_01 = CATNNode<wchar_t>::get_submachine(this_00);
      bVar1 = Identifier::operator==(this_01,id);
      if (bVar1) {
        iVar3 = ATNPath::count(stack,&pvStack_58->first,local_5c);
        if (1 < iVar3) {
          local_95 = 1;
          this_02 = (SimpleException *)__cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_80,"Upward sentinel reached.",&local_81);
          SimpleException::SimpleException(this_02,&local_80);
          local_95 = 0;
          __cxa_throw(this_02,&SimpleException::typeinfo,SimpleException::~SimpleException);
        }
        ATNPath::push(stack,&pvStack_58->first,local_5c);
        ATNPath::ATNPath(&local_b8,&pvStack_58->first,local_5c);
        build_departure_set_r(this,deptset_factory,&local_b8,color,priority,stack);
        ATNPath::~ATNPath(&local_b8);
        ATNPath::pop(stack);
      }
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>,_false,_true>
    ::operator++(&__end0);
  } while( true );
}

Assistant:

void CompositeATN<TCHAR>::build_wildcard_departure_set(CATNDepartureSetFactory<TCHAR>& deptset_factory, const Identifier& id, int color, const PriorityChain& priority, ATNStateStack& stack) const
{
    for (const auto& p : m_dict)
    {
        for (int i = 0; i < p.second.get_num_nodes(); i++)
        {
            if (p.second[i].get_submachine() == id)
            {
                if (stack.count(p.first, i) >= 2)
                {
                    //std::cout << "Upward sentinel reached." << std::endl;
                    throw SimpleException("Upward sentinel reached.");
                    //continue;
                }
                stack.push(p.first, i);
                build_departure_set_r(deptset_factory, ATNPath(p.first, i), color, priority, stack);
                stack.pop();
            }
        }
    }
}